

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O0

int ini_save(ini_t *ini,char *data,int size)

{
  int iVar1;
  int iVar2;
  char *local_60;
  char *local_58;
  ini_internal_section_t *local_50;
  int local_44;
  int pos;
  char *n;
  int local_30;
  int l;
  int i;
  int p;
  int s;
  int size_local;
  char *data_local;
  ini_t *ini_local;
  
  if (ini == (ini_t *)0x0) {
    ini_local._4_4_ = 0;
  }
  else {
    local_44 = 0;
    for (i = 0; i < ini->section_count; i = i + 1) {
      if (ini->sections[i].name_large == (char *)0x0) {
        local_50 = ini->sections + i;
      }
      else {
        local_50 = (ini_internal_section_t *)ini->sections[i].name_large;
      }
      iVar1 = sx_strlen(local_50->name);
      if (0 < iVar1) {
        if ((data != (char *)0x0) && (local_44 < size)) {
          data[local_44] = '[';
        }
        iVar2 = local_44;
        for (local_30 = 0; local_44 = iVar2 + 1, local_30 < iVar1; local_30 = local_30 + 1) {
          if ((data != (char *)0x0) && (local_44 < size)) {
            data[local_44] = local_50->name[local_30];
          }
          iVar2 = local_44;
        }
        if ((data != (char *)0x0) && (local_44 < size)) {
          data[local_44] = ']';
        }
        if ((data != (char *)0x0) && (iVar2 + 2 < size)) {
          data[iVar2 + 2] = '\n';
        }
        local_44 = iVar2 + 3;
      }
      for (l = 0; l < ini->property_count; l = l + 1) {
        if (ini->properties[l].section == i) {
          if (ini->properties[l].name_large == (char *)0x0) {
            local_58 = ini->properties[l].name;
          }
          else {
            local_58 = ini->properties[l].name_large;
          }
          iVar1 = sx_strlen(local_58);
          for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
            if ((data != (char *)0x0) && (local_44 < size)) {
              data[local_44] = local_58[local_30];
            }
            local_44 = local_44 + 1;
          }
          if ((data != (char *)0x0) && (local_44 < size)) {
            data[local_44] = '=';
          }
          if (ini->properties[l].value_large == (char *)0x0) {
            local_60 = ini->properties[l].value;
          }
          else {
            local_60 = ini->properties[l].value_large;
          }
          iVar2 = sx_strlen(local_60);
          iVar1 = local_44;
          for (local_30 = 0; local_44 = iVar1 + 1, local_30 < iVar2; local_30 = local_30 + 1) {
            if ((data != (char *)0x0) && (local_44 < size)) {
              data[local_44] = local_60[local_30];
            }
            iVar1 = local_44;
          }
          if ((data != (char *)0x0) && (local_44 < size)) {
            data[local_44] = '\n';
          }
          local_44 = iVar1 + 2;
        }
      }
      if (0 < local_44) {
        if ((data != (char *)0x0) && (local_44 < size)) {
          data[local_44] = '\n';
        }
        local_44 = local_44 + 1;
      }
    }
    if ((data != (char *)0x0) && (local_44 < size)) {
      data[local_44] = '\0';
    }
    ini_local._4_4_ = local_44 + 1;
  }
  return ini_local._4_4_;
}

Assistant:

int ini_save( ini_t const* ini, char* data, int size )
    {
    int s;
    int p;
    int i;
    int l;
    char* n;
    int pos;

    if( ini )
        {
        pos = 0;
        for( s = 0; s < ini->section_count; ++s )
            {
            n = ini->sections[ s ].name_large ? ini->sections[ s ].name_large : ini->sections[ s ].name;
            l = (int) INI_STRLEN( n );
            if( l > 0 )
                {
                if( data && pos < size ) data[ pos ] = '[';
                ++pos;
                for( i = 0; i < l; ++i )
                    {
                    if( data && pos < size ) data[ pos ] = n[ i ];
                    ++pos;
                    }
                if( data && pos < size ) data[ pos ] = ']';
                ++pos;
                if( data && pos < size ) data[ pos ] = '\n';
                ++pos;
                }

            for( p = 0; p < ini->property_count; ++p )
                {
                if( ini->properties[ p ].section == s )
                    {
                    n = ini->properties[ p ].name_large ? ini->properties[ p ].name_large : ini->properties[ p ].name;
                    l = (int) INI_STRLEN( n );
                    for( i = 0; i < l; ++i )
                        {
                        if( data && pos < size ) data[ pos ] = n[ i ];
                        ++pos;
                        }
                    if( data && pos < size ) data[ pos ] = '=';
                    ++pos;
                    n = ini->properties[ p ].value_large ? ini->properties[ p ].value_large : ini->properties[ p ].value;
                    l = (int) INI_STRLEN( n );
                    for( i = 0; i < l; ++i )
                        {
                        if( data && pos < size ) data[ pos ] = n[ i ];
                        ++pos;
                        }
                    if( data && pos < size ) data[ pos ] = '\n';
                    ++pos;
                    }
                }

            if( pos > 0 )
                {
                if( data && pos < size ) data[ pos ] = '\n';
                ++pos;
                }
            }

        if( data && pos < size ) data[ pos ] = '\0';
        ++pos;

        return pos;
        }

    return 0;
    }